

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::DepthRangeCompareCase::iterate(DepthRangeCompareCase *this)

{
  undefined *puVar1;
  bool bVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  GLenum GVar9;
  float fVar10;
  char *str;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  TestError *this_02;
  TestLog *this_03;
  MessageBuilder *pMVar12;
  float *pfVar13;
  float y_00;
  float fVar14;
  char *local_660;
  RGBA local_4ac;
  bool isOk;
  bool dpass_1;
  float d_1;
  float rd;
  float xh;
  float xf_1;
  int x_1;
  bool dpass;
  float d;
  float xf;
  int x;
  int half;
  float yf;
  int y;
  undefined4 local_448;
  undefined4 local_444;
  float position [16];
  MessageBuilder local_400;
  GLuint local_27c;
  GLint local_278;
  int posLoc;
  int colorLoc;
  allocator<char> local_249;
  string local_248;
  ProgramSources local_228;
  undefined1 local_158 [8];
  ShaderProgram program;
  undefined1 local_80 [4];
  float constDepth;
  Surface referenceFrame;
  Surface renderedFrame;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Random rnd;
  TestLog *log;
  DepthRangeCompareCase *this_local;
  RenderTarget *this_00;
  
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&renderTarget,dVar3);
  pRVar11 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar11->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar4);
  iVar4 = tcu::RenderTarget::getWidth(this_00);
  iVar4 = de::min<int>(0x80,iVar4);
  iVar5 = tcu::RenderTarget::getHeight(this_00);
  iVar5 = de::min<int>(0x80,iVar5);
  iVar6 = tcu::RenderTarget::getWidth(this_00);
  iVar6 = de::Random::getInt((Random *)&renderTarget,0,iVar6 - iVar4);
  iVar7 = tcu::RenderTarget::getHeight(this_00);
  iVar7 = de::Random::getInt((Random *)&renderTarget,0,iVar7 - iVar5);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,iVar4,iVar5);
  tcu::Surface::Surface((Surface *)local_80,iVar4,iVar5);
  program.m_program.m_info.linkTimeUs._4_4_ = 0x3dcccccd;
  iVar8 = tcu::RenderTarget::getDepthBits(this_00);
  if (iVar8 == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x9a);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar11 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  puVar1 = s_vertexShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,puVar1,&local_249);
  puVar1 = s_fragmentShaderSrc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorLoc,puVar1,(allocator<char> *)((long)&posLoc + 3));
  glu::makeVtxFragSources(&local_228,&local_248,(string *)&colorLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_158,pRVar11,&local_228);
  glu::ProgramSources::~ProgramSources(&local_228);
  std::__cxx11::string::~string((string *)&colorLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&posLoc + 3));
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_158);
  if (!bVar2) {
    glu::operator<<((TestLog *)rnd.m_rnd._8_8_,(ShaderProgram *)local_158);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0xa1);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  local_278 = glwGetUniformLocation(dVar3,"u_color");
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  local_27c = glwGetAttribLocation(dVar3,"a_position");
  this_03 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_400,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<(&local_400,(char (*) [15])"glDepthRangef(");
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_zNear);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [3])0x2a3caab);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_zFar);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2a85ff4);
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_400);
  glwViewport(iVar6,iVar7,iVar4,iVar5);
  glwClear(0x4500);
  glwEnable(0xb71);
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  glwUseProgram(dVar3);
  glwEnableVertexAttribArray(local_27c);
  glwUniform4f(local_278,0.0,0.0,1.0,1.0);
  glwDepthFunc(0x207);
  glwVertexAttribPointer(local_27c,4,0x1406,'\0',0,iterate::constDepthCoord);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  glwVertexAttribPointer(local_27c,4,0x1406,'\0',0,iterate::varyingDepthCoord);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  GVar9 = glwGetError();
  glu::checkError(GVar9,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0xcb);
  local_448 = 0xbf800000;
  local_444 = 0xbf800000;
  pfVar13 = tcu::Vector<float,_4>::operator[](&this->m_depthCoord,0);
  position[0] = *pfVar13;
  position[1] = 1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  pfVar13 = tcu::Vector<float,_4>::operator[](&this->m_depthCoord,1);
  position[4] = *pfVar13;
  position[5] = 1.0;
  position[6] = 1.0;
  position[7] = -1.0;
  pfVar13 = tcu::Vector<float,_4>::operator[](&this->m_depthCoord,2);
  position[8] = *pfVar13;
  position[9] = 1.0;
  position[10] = 1.0;
  position[0xb] = 1.0;
  pfVar13 = tcu::Vector<float,_4>::operator[](&this->m_depthCoord,3);
  position[0xc] = *pfVar13;
  position[0xd] = 1.0;
  glwDepthRangef(this->m_zNear,this->m_zFar);
  glwDepthFunc(this->m_compareFunc);
  glwUniform4f(local_278,0.0,1.0,0.0,1.0);
  glwVertexAttribPointer(local_27c,4,0x1406,'\0',0,&local_448);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  GVar9 = glwGetError();
  glu::checkError(GVar9,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0xdf);
  pRVar11 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&yf,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar11,iVar6,iVar7,(PixelBufferAccess *)&yf);
  for (half = 0; iVar4 = tcu::Surface::getHeight((Surface *)local_80), half < iVar4; half = half + 1
      ) {
    iVar4 = tcu::Surface::getHeight((Surface *)local_80);
    y_00 = ((float)half + 0.5) / (float)iVar4;
    iVar4 = tcu::Surface::getWidth((Surface *)local_80);
    iVar5 = tcu::Surface::getWidth((Surface *)local_80);
    fVar10 = (float)de::clamp<int>((int)((float)iVar4 * 0.5 + 0.5),0,iVar5);
    for (d = 0.0; xh = fVar10, (int)d < (int)fVar10; d = (float)((int)d + 1)) {
      iVar4 = tcu::Surface::getWidth((Surface *)local_80);
      fVar14 = triQuadInterpolate(((float)(int)d + 0.5) / (float)iVar4,y_00,&this->m_depthCoord);
      fVar14 = depthRangeTransform(fVar14,this->m_zNear,this->m_zFar);
      bVar2 = compare<float>(this->m_compareFunc,fVar14,0.55);
      if (bVar2) {
        xf_1 = (float)tcu::RGBA::green();
      }
      else {
        xf_1 = (float)tcu::RGBA::blue();
      }
      tcu::Surface::setPixel((Surface *)local_80,(int)d,half,(RGBA)xf_1);
    }
    for (; iVar4 = tcu::Surface::getWidth((Surface *)local_80), (int)xh < iVar4;
        xh = (float)((int)xh + 1)) {
      iVar4 = tcu::Surface::getWidth((Surface *)local_80);
      iVar5 = tcu::Surface::getWidth((Surface *)local_80);
      fVar14 = triQuadInterpolate(((float)(int)xh + 0.5) / (float)iVar4,y_00,&this->m_depthCoord);
      fVar14 = depthRangeTransform(fVar14,this->m_zNear,this->m_zFar);
      bVar2 = compare<float>(this->m_compareFunc,fVar14,
                             (((float)((int)xh - (int)fVar10) + 0.5) / (float)(iVar5 - (int)fVar10)
                             + y_00) * -0.5 + 1.0);
      if (bVar2) {
        local_4ac = tcu::RGBA::green();
      }
      else {
        local_4ac = tcu::RGBA::blue();
      }
      tcu::Surface::setPixel((Surface *)local_80,(int)xh,half,local_4ac);
    }
  }
  bVar2 = tcu::fuzzyCompare((TestLog *)rnd.m_rnd._8_8_,"Result","Image comparison result",
                            (Surface *)local_80,(Surface *)&referenceFrame.m_pixels.m_cap,0.05,
                            COMPARE_LOG_RESULT);
  if (bVar2) {
    local_660 = "Pass";
  }
  else {
    local_660 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,local_660);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_158);
  tcu::Surface::~Surface((Surface *)local_80);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)&renderTarget);
  return STOP;
}

Assistant:

DepthRangeCompareCase::IterateResult DepthRangeCompareCase::iterate (void)
{
	TestLog&					log					= m_testCtx.getLog();
	de::Random					rnd					(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					viewportW			= de::min(128, renderTarget.getWidth());
	const int					viewportH			= de::min(128, renderTarget.getHeight());
	const int					viewportX			= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	const int					viewportY			= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame		(viewportW, viewportH);
	tcu::Surface				referenceFrame		(viewportW, viewportH);
	const float					constDepth			= 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	const glu::ShaderProgram	program				(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_fragmentShaderSrc));

	if (!program.isOk())
	{
		log << program;
		TCU_FAIL("Compile failed");
	}

	const int					colorLoc			= glGetUniformLocation(program.getProgram(), "u_color");
	const int					posLoc				= glGetAttribLocation(program.getProgram(), "a_position");

	m_testCtx.getLog() << TestLog::Message << "glDepthRangef(" << m_zNear << ", " << m_zFar << ")" << TestLog::EndMessage;

	glViewport(viewportX, viewportY, viewportW, viewportH);
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glUseProgram(program.getProgram());
	glEnableVertexAttribArray(posLoc);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		static const float constDepthCoord[] =
		{
			-1.0f, -1.0f, constDepth, 1.0f,
			-1.0f, +1.0f, constDepth, 1.0f,
			 0.0f, -1.0f, constDepth, 1.0f,
			 0.0f, +1.0f, constDepth, 1.0f
		};
		static const float varyingDepthCoord[] =
		{
			 0.0f, -1.0f, +1.0f, 1.0f,
			 0.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		glUniform4f(colorLoc, 0.0f, 0.0f, 1.0f, 1.0f);
		glDepthFunc(GL_ALWAYS);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &constDepthCoord);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &varyingDepthCoord);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		GLU_CHECK();
	}

	// Render with depth test.
	{
		const float position[] =
		{
			-1.0f, -1.0f, m_depthCoord[0], 1.0f,
			-1.0f, +1.0f, m_depthCoord[1], 1.0f,
			+1.0f, -1.0f, m_depthCoord[2], 1.0f,
			+1.0f, +1.0f, m_depthCoord[3], 1.0f
		};

		glDepthRangef(m_zNear, m_zFar);
		glDepthFunc(m_compareFunc);
		glUniform4f(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		GLU_CHECK();
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int		half	= de::clamp((int)((float)referenceFrame.getWidth()*0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			bool	dpass	= compare(m_compareFunc, d, constDepth*0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	xh		= ((float)(x - half) + 0.5f) / (float)(referenceFrame.getWidth()-half);
			float	rd		= 1.0f - (xh + yf) * 0.5f;
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			bool	dpass	= compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}